

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseRandom(FScanner *sc,FName *identifier,PClassActor *cls)

{
  FxExpression *pFVar1;
  FxExpression *pFVar2;
  FxExpression *pFVar3;
  bool bVar4;
  FScanner *pFVar5;
  FScriptPosition local_70;
  undefined1 local_5d;
  FScriptPosition local_50;
  FxExpression *local_40;
  FxExpression *max;
  FxExpression *min;
  FRandom *rng;
  PClassActor *cls_local;
  FName *identifier_local;
  FScanner *sc_local;
  
  rng = (FRandom *)cls;
  cls_local = (PClassActor *)identifier;
  identifier_local = (FName *)sc;
  min = (FxExpression *)ParseRNG(sc);
  FScanner::MustGetToken((FScanner *)identifier_local,0x28);
  max = ParseExpressionM((FScanner *)identifier_local,(PClassActor *)rng);
  FScanner::MustGetToken((FScanner *)identifier_local,0x2c);
  local_40 = ParseExpressionM((FScanner *)identifier_local,(PClassActor *)rng);
  FScanner::MustGetToken((FScanner *)identifier_local,0x29);
  bVar4 = FName::operator==(identifier,NAME_Random);
  if (bVar4) {
    pFVar5 = (FScanner *)operator_new(0x50);
    pFVar3 = min;
    pFVar2 = max;
    pFVar1 = local_40;
    local_5d = 1;
    FScriptPosition::FScriptPosition(&local_50,(FScanner *)identifier_local);
    FxRandom::FxRandom((FxRandom *)pFVar5,(FRandom *)pFVar3,pFVar2,pFVar1,&local_50);
    local_5d = 0;
    sc_local = pFVar5;
    FScriptPosition::~FScriptPosition(&local_50);
  }
  else {
    pFVar5 = (FScanner *)operator_new(0x50);
    pFVar3 = min;
    pFVar2 = max;
    pFVar1 = local_40;
    FScriptPosition::FScriptPosition(&local_70,(FScanner *)identifier_local);
    FxFRandom::FxFRandom((FxFRandom *)pFVar5,(FRandom *)pFVar3,pFVar2,pFVar1,&local_70);
    sc_local = pFVar5;
    FScriptPosition::~FScriptPosition(&local_70);
  }
  return (FxExpression *)sc_local;
}

Assistant:

static FxExpression *ParseRandom(FScanner &sc, FName identifier, PClassActor *cls)
{
	FRandom *rng = ParseRNG(sc);

	sc.MustGetToken('(');
	FxExpression *min = ParseExpressionM (sc, cls);
	sc.MustGetToken(',');
	FxExpression *max = ParseExpressionM (sc, cls);
	sc.MustGetToken(')');

	if (identifier == NAME_Random)
	{
		return new FxRandom(rng, min, max, sc);
	}
	else
	{
		return new FxFRandom(rng, min, max, sc);
	}
}